

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseExternalEntity
              (xmlDocPtr doc,xmlSAXHandlerPtr sax,void *user_data,int depth,xmlChar *URL,xmlChar *ID
              ,xmlNodePtr *list)

{
  xmlParserCtxtPtr ctxt_00;
  int ret;
  xmlParserCtxtPtr ctxt;
  xmlChar *ID_local;
  xmlChar *URL_local;
  int depth_local;
  void *user_data_local;
  xmlSAXHandlerPtr sax_local;
  xmlDocPtr doc_local;
  
  if (list != (xmlNodePtr *)0x0) {
    *list = (xmlNodePtr)0x0;
  }
  if (doc == (xmlDocPtr)0x0) {
    doc_local._4_4_ = 0x73;
  }
  else {
    ctxt_00 = xmlNewSAXParserCtxt(sax,user_data);
    if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
      doc_local._4_4_ = 2;
    }
    else {
      ctxt_00->depth = depth;
      ctxt_00->myDoc = doc;
      doc_local._4_4_ = xmlParseCtxtExternalEntity(ctxt_00,URL,ID,list);
      xmlFreeParserCtxt(ctxt_00);
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlParseExternalEntity(xmlDocPtr doc, xmlSAXHandlerPtr sax, void *user_data,
	  int depth, const xmlChar *URL, const xmlChar *ID, xmlNodePtr *list) {
    xmlParserCtxtPtr ctxt;
    int ret;

    if (list != NULL)
        *list = NULL;

    if (doc == NULL)
        return(XML_ERR_ARGUMENT);

    ctxt = xmlNewSAXParserCtxt(sax, user_data);
    if (ctxt == NULL)
        return(XML_ERR_NO_MEMORY);

    ctxt->depth = depth;
    ctxt->myDoc = doc;
    ret = xmlParseCtxtExternalEntity(ctxt, URL, ID, list);

    xmlFreeParserCtxt(ctxt);
    return(ret);
}